

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc_global.h
# Opt level: O2

void Abc_PrintInt(int i)

{
  char *format;
  int level;
  double dVar1;
  double dVar2;
  
  level = i;
  Abc_Print(i,"  ");
  if (i + 999U < 1999) {
    Abc_Print(level," %4d",(ulong)(uint)i);
    return;
  }
  dVar1 = (double)i / 1000.0;
  dVar2 = ABS(dVar1);
  if (9.995 <= dVar2) {
    if (99.95 <= dVar2) {
      if (999.5 <= dVar2) {
        dVar1 = (double)i / 1000000.0;
        dVar2 = ABS(dVar1);
        if (9.995 <= dVar2) {
          if (99.95 <= dVar2) {
            if (999.5 <= dVar2) {
              return;
            }
            format = "%4.0fm";
          }
          else {
            format = "%4.1fm";
          }
        }
        else {
          format = "%4.2fm";
        }
      }
      else {
        format = "%4.0fk";
      }
    }
    else {
      format = "%4.1fk";
    }
  }
  else {
    format = "%4.2fk";
  }
  Abc_Print(level,format,dVar1);
  return;
}

Assistant:

static inline void Abc_PrintInt( int i )
{
    double v3 = (double)i/1000;
    double v6 = (double)i/1000000;

    Abc_Print( 1,  "  " );

    if ( i > -1000 && i < 1000 )
        Abc_Print( 1, " %4d", i );

    else if ( v3 > -9.995 && v3 < 9.995 )
        Abc_Print( 1, "%4.2fk", v3 );
    else if ( v3 > -99.95 && v3 < 99.95 )
        Abc_Print( 1, "%4.1fk", v3 );
    else if ( v3 > -999.5 && v3 < 999.5 )
        Abc_Print( 1, "%4.0fk", v3 );

    else if ( v6 > -9.995 && v6 < 9.995 )
        Abc_Print( 1, "%4.2fm", v6 );
    else if ( v6 > -99.95 && v6 < 99.95 )
        Abc_Print( 1, "%4.1fm", v6 );
    else if ( v6 > -999.5 && v6 < 999.5 )
        Abc_Print( 1, "%4.0fm", v6 );
}